

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *_other)

{
  bool bVar1;
  CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_00;
  Index IVar2;
  Index IVar3;
  Index othersize;
  CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *other;
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *_other_local;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  bool error;
  long max_index;
  
  this_00 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::derived(_other);
  IVar2 = CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::rows(this_00);
  IVar3 = CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::cols(this_00);
  if ((IVar2 == 0) || (IVar3 == 0)) {
    bVar1 = false;
  }
  else {
    bVar1 = 0x7fffffffffffffff / IVar3 < IVar2;
  }
  if (bVar1) {
    internal::throw_std_bad_alloc();
  }
  CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::rows(this_00);
  CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::cols(this_00);
  IVar2 = CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::rows(this_00);
  IVar3 = CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::cols(this_00);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,IVar2,IVar3);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }